

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NussinovAlgorithm.cpp
# Opt level: O1

int __thiscall NussinovAlgorithm::get_nbp(NussinovAlgorithm *this,int i,int j)

{
  ulong uVar1;
  int iVar2;
  string bp;
  string local_28;
  
  get_bp_abi_cxx11_(&local_28,this,i,j);
  if ((int)(uint)local_28._M_string_length < 1) {
    iVar2 = 0;
  }
  else {
    uVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(local_28._M_dataplus._M_p[uVar1] == '(');
      uVar1 = uVar1 + 1;
    } while (((uint)local_28._M_string_length & 0x7fffffff) != uVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

int NussinovAlgorithm::get_nbp(int i, int j) {
    string bp = get_bp(i,j);
    int count = 0;
    for (int k = 0; k < (int)bp.size(); k++) {
        if (bp[k] == '(') count++;
    }
    return count;
}